

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.cpp
# Opt level: O2

void loadXYZ(string *filePath,vector<Vector3D,_std::allocator<Vector3D>_> *pos)

{
  char cVar1;
  istream *piVar2;
  string line;
  double z;
  double y;
  double x;
  ifstream file;
  byte abStack_3a0 [488];
  stringstream lineStream;
  
  std::ifstream::ifstream(&file,(string *)filePath,_S_in);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 != '\0') {
    while ((abStack_3a0[*(long *)(_file + -0x18)] & 5) == 0) {
      line._M_dataplus._M_p = (pointer)&line.field_2;
      line._M_string_length = 0;
      line.field_2._M_local_buf[0] = '\0';
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)&file,(string *)&line);
      if (3 < line._M_string_length) {
        std::__cxx11::stringstream::stringstream
                  ((stringstream *)&lineStream,(string *)&line,_S_out|_S_in);
        piVar2 = std::istream::_M_extract<double>((double *)&lineStream);
        piVar2 = std::istream::_M_extract<double>((double *)piVar2);
        std::istream::_M_extract<double>((double *)piVar2);
        std::vector<Vector3D,std::allocator<Vector3D>>::emplace_back<double&,double&,double&>
                  ((vector<Vector3D,std::allocator<Vector3D>> *)pos,&x,&y,&z);
        std::__cxx11::stringstream::~stringstream((stringstream *)&lineStream);
      }
      std::__cxx11::string::~string((string *)&line);
    }
    std::ifstream::close();
  }
  std::ifstream::~ifstream(&file);
  return;
}

Assistant:

void loadXYZ(std::string filePath, std::vector<Vector3D> &pos){
    std::ifstream file(filePath);
    if (file.is_open()){
        while (file){
            std::string line;
            std::getline(file, line);
            if(line.size()>3){
                std::stringstream lineStream(line);
                double x, y, z;
                lineStream >> x >> y >>z;
                pos.emplace_back(x, y, z);
            }
        }
        file.close();
    }




}